

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O2

bool testing::Mock::VerifyAndClearExpectationsLocked(void *mock_obj)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  key_type *in_RSI;
  
  internal::MutexBase::AssertHeld((MutexBase *)internal::g_gmock_mutex);
  sVar2 = std::
          map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
          ::count((map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
                   *)&stack0xffffffffffffffe0,in_RSI);
  if (sVar2 == 0) {
    bVar5 = true;
  }
  else {
    pmVar3 = std::
             map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
             ::operator[]((map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
                           *)&stack0xffffffffffffffe0,in_RSI);
    bVar5 = true;
    for (p_Var4 = (pmVar3->function_mockers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(pmVar3->function_mockers)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      bVar1 = internal::UntypedFunctionMockerBase::VerifyAndClearExpectationsLocked
                        (*(UntypedFunctionMockerBase **)(p_Var4 + 1));
      bVar5 = (bool)(bVar5 & bVar1);
    }
  }
  return bVar5;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(internal::g_gmock_mutex) {
  internal::g_gmock_mutex.AssertHeld();
  if (g_mock_object_registry.states().count(mock_obj) == 0) {
    // No EXPECT_CALL() was set on the given mock object.
    return true;
  }

  // Verifies and clears the expectations on each mock method in the
  // given mock object.
  bool expectations_met = true;
  FunctionMockers& mockers =
      g_mock_object_registry.states()[mock_obj].function_mockers;
  for (FunctionMockers::const_iterator it = mockers.begin();
       it != mockers.end(); ++it) {
    if (!(*it)->VerifyAndClearExpectationsLocked()) {
      expectations_met = false;
    }
  }

  // We don't clear the content of mockers, as they may still be
  // needed by ClearDefaultActionsLocked().
  return expectations_met;
}